

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointTest.cpp
# Opt level: O1

void __thiscall PointApplyDiff::test_method(PointApplyDiff *this)

{
  bool bVar1;
  double *pdVar2;
  undefined8 *puVar3;
  char *__function;
  Index cols;
  MatrixXd J;
  MatrixXd expectedRes;
  MatrixXd Jf;
  SO3<mnf::ExpMapMatrix> S;
  Point x;
  Matrix<double,__1,__1,_0,__1,__1> local_2f8;
  Matrix<double,__1,__1,_0,__1,__1> local_2d8;
  void *local_2c0 [2];
  long local_2b0;
  Matrix<double,__1,__1,_0,__1,__1> local_2a8;
  assign_op<double,_double> *paStack_290;
  undefined8 uStack_288;
  void *local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  char *local_268;
  char *local_260;
  double *local_258;
  undefined8 uStack_250;
  double *local_248;
  undefined8 uStack_240;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_230;
  shared_count sStack_220;
  RealScalar local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  SO3<mnf::ExpMapMatrix> local_1e0;
  undefined8 local_140;
  void *local_138;
  ConstSubPoint local_128 [272];
  
  mnf::SO3<mnf::ExpMapMatrix>::SO3(&local_1e0);
  pdVar2 = (double *)mnf::Manifold::dim();
  local_138 = (void *)mnf::Manifold::representationDim();
  local_140 = 5;
  if ((long)local_138 < 0) {
    __function = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_random_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
    ;
  }
  else {
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_2c0,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_140);
    mnf::Manifold::getZero();
    local_2d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         pdVar2;
    if (-1 < (long)pdVar2) {
      local_2a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      local_2a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           0;
      paStack_290 = (assign_op<double,_double> *)0x0;
      uStack_288 = 0;
      Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
      construct<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_2a8,
                 &local_2d8);
      mnf::Point::retractation((Point *)&local_140,(Ref *)&local_140);
      free(paStack_290);
      local_2d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      local_2d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           0;
      local_2d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           0;
      mnf::Point::diffRetractation();
      if (local_2b0 !=
          local_2f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows) {
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                      "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
                     );
      }
      local_230.m_lhs = (LhsNested)local_2c0;
      local_230.m_rhs = &local_2f8;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_2a8,&local_230);
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                (&local_2d8,&local_2a8,(assign_op<double,_double> *)&local_268);
      free(local_2a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      free(local_2f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      local_2f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      local_2f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           0;
      local_2f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           0;
      if (pdVar2 < (double *)0x199999999999999a) {
        if ((long)pdVar2 * -5 != 0) {
          free((void *)0x0);
          if (pdVar2 == (double *)0x0) {
            local_2f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data = (double *)0x0;
          }
          else {
            local_2f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data = Eigen::internal::conditional_aligned_new_auto<double,true>((long)pdVar2 * 5);
          }
        }
        local_2f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
             = 5;
        local_258 = local_2f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data;
        uStack_250 = 5;
        uStack_240 = 5;
        local_2a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
             = 0;
        paStack_290 = (assign_op<double,_double> *)0x0;
        local_2a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
             = (double *)0x0;
        local_2a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
             = 0;
        local_280 = (void *)0x0;
        uStack_278 = 0;
        local_270 = 0;
        local_2f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
             = (Index)pdVar2;
        local_248 = pdVar2;
        Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
        construct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                   &local_2a8,local_2c0);
        mnf::Point::applyDiffRetractation(&local_140,&local_258,&local_2a8);
        free(local_280);
        local_1f0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
        ;
        local_1e8 = "";
        local_200 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0xe8);
        local_218 = 1e-12;
        bVar1 = Eigen::internal::
                isApprox_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
                ::run(&local_2d8,&local_2f8,&local_218);
        local_230.m_lhs = (LhsNested)CONCAT71(local_230.m_lhs._1_7_,bVar1);
        local_230.m_rhs = (RhsNested)0x0;
        sStack_220.pi_ = (sp_counted_base *)0x0;
        local_268 = "expectedRes.isApprox(J)";
        local_260 = "";
        local_2a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
             = local_2a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows & 0xffffffffffffff00;
        local_2a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
             = (double *)&PTR__lazy_ostream_00129c08;
        local_2a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
             = (Index)&boost::unit_test::lazy_ostream::inst;
        local_210 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
        ;
        local_208 = "";
        paStack_290 = (assign_op<double,_double> *)&local_268;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_220);
        free(local_2f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        free(local_2d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        mnf::ConstSubPoint::~ConstSubPoint(local_128);
        free(local_138);
        free(local_2c0[0]);
        local_1e0._0_8_ = &PTR__SO3_001299c0;
        mnf::ReusableTemporaryMap::~ReusableTemporaryMap
                  ((ReusableTemporaryMap *)((long)&local_1e0 + 0x58));
        mnf::Manifold::~Manifold(&local_1e0.super_Manifold);
        return;
      }
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = mnf::Point::Point;
      __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    __function = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_random_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
    ;
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,__function);
}

Assistant:

BOOST_AUTO_TEST_CASE(PointApplyDiff)
{
  int c = 5;
  SO3<ExpMapMatrix> S;
  Index dim = S.dim();
  Index repDim = S.representationDim();
  Eigen::MatrixXd Jf = Eigen::MatrixXd::Random(c, repDim);
  Point x = S.getZero();
  x.retractation(x, Eigen::VectorXd::Random(dim));
  Eigen::MatrixXd expectedRes;
  expectedRes = Jf * x.diffRetractation();
  Eigen::MatrixXd J(c, dim);
  x.applyDiffRetractation(J, Jf);
  BOOST_CHECK(expectedRes.isApprox(J));
}